

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
randomx::VmBase<randomx::LargePageAllocator,_true>::~VmBase
          (VmBase<randomx::LargePageAllocator,_true> *this)

{
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_00148808;
  LargePageAllocator::freeMemory(in_RDI,in_stack_ffffffffffffffe8);
  randomx_vm::~randomx_vm((randomx_vm *)0x126f0e);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}